

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xmlwrite_heap(archive_write *a,xml_writer *writer,heap_data *heap)

{
  int iVar1;
  char *pcStack_30;
  int r;
  char *encname;
  heap_data *heap_local;
  xml_writer *writer_local;
  archive_write *a_local;
  
  iVar1 = xmlwrite_fstring(a,writer,"length","%ju",heap->length);
  if (iVar1 < 0) {
    a_local._4_4_ = -0x1e;
  }
  else {
    iVar1 = xmlwrite_fstring(a,writer,"offset","%ju",heap->temp_offset);
    if (iVar1 < 0) {
      a_local._4_4_ = -0x1e;
    }
    else {
      iVar1 = xmlwrite_fstring(a,writer,"size","%ju",heap->size);
      if (iVar1 < 0) {
        a_local._4_4_ = -0x1e;
      }
      else {
        switch(heap->compression) {
        case GZIP:
          pcStack_30 = "application/x-gzip";
          break;
        case BZIP2:
          pcStack_30 = "application/x-bzip2";
          break;
        case LZMA:
          pcStack_30 = "application/x-lzma";
          break;
        case XZ:
          pcStack_30 = "application/x-xz";
          break;
        default:
          pcStack_30 = "application/octet-stream";
        }
        iVar1 = xmlwrite_string_attr(a,writer,"encoding",(char *)0x0,"style",pcStack_30);
        if (iVar1 < 0) {
          a_local._4_4_ = -0x1e;
        }
        else {
          iVar1 = xmlwrite_sum(a,writer,"archived-checksum",&heap->a_sum);
          if (iVar1 < 0) {
            a_local._4_4_ = -0x1e;
          }
          else {
            iVar1 = xmlwrite_sum(a,writer,"extracted-checksum",&heap->e_sum);
            if (iVar1 < 0) {
              a_local._4_4_ = -0x1e;
            }
            else {
              a_local._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
xmlwrite_heap(struct archive_write *a, struct xml_writer *writer,
	struct heap_data *heap)
{
	const char *encname;
	int r;

	r = xmlwrite_fstring(a, writer, "length", "%ju", heap->length);
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = xmlwrite_fstring(a, writer, "offset", "%ju", heap->temp_offset);
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = xmlwrite_fstring(a, writer, "size", "%ju", heap->size);
	if (r < 0)
		return (ARCHIVE_FATAL);
	switch (heap->compression) {
	case GZIP:
		encname = "application/x-gzip"; break;
	case BZIP2:
		encname = "application/x-bzip2"; break;
	case LZMA:
		encname = "application/x-lzma"; break;
	case XZ:
		encname = "application/x-xz"; break;
	default:
		encname = "application/octet-stream"; break;
	}
	r = xmlwrite_string_attr(a, writer, "encoding", NULL,
	    "style", encname);
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = xmlwrite_sum(a, writer, "archived-checksum", &(heap->a_sum));
	if (r < 0)
		return (ARCHIVE_FATAL);
	r = xmlwrite_sum(a, writer, "extracted-checksum", &(heap->e_sum));
	if (r < 0)
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}